

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

string * __thiscall
deqp::gles2::Performance::loopVertexTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,LoopType type,bool isVertexCase,
          int numLoopIterations,int nestingDepth)

{
  size_t sVar1;
  long *plVar2;
  undefined7 in_register_00000009;
  char *pcVar3;
  long *plVar4;
  int iVar5;
  ulong uVar6;
  bool *__s;
  string iterName;
  string loopBound;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  int local_2f4;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  ulong local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  iVar5 = (int)this;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (iVar5 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<(&local_1a8,(int)CONCAT71(in_register_00000009,isVertexCase));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    pcVar3 = glcts::fixed_sample_locations_values + 1;
    if (iVar5 == 2) {
      pcVar3 = "int(a_loopBound${NAME_SPEC})";
    }
    __s = (bool *)"int(u_loopBound${NAME_SPEC})";
    if (iVar5 != 1) {
      __s = (bool *)pcVar3;
    }
    local_1d0[0] = local_1c0;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,__s,__s + sVar1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (iVar5 == 2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((char)type == '\0') {
    if (iVar5 == 2) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (iVar5 != 2) goto LAB_0104ff1f;
  }
  else {
    if (iVar5 == 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_2f4 = numLoopIterations;
    if (0 < numLoopIterations) {
      local_1b0 = (ulong)(uint)numLoopIterations;
      uVar6 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,(int)uVar6);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0x1c858c1);
        local_318 = &local_308;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_308 = *plVar4;
          lStack_300 = plVar2[3];
        }
        else {
          local_308 = *plVar4;
          local_318 = (long *)*plVar2;
        }
        local_310 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        uVar6 = uVar6 + 1;
        local_1f0[0] = local_1e0;
        std::__cxx11::string::_M_construct((ulong)local_1f0,(char)uVar6);
        plVar2 = (long *)std::__cxx11::string::append((char *)local_1f0);
        local_2d0 = &local_2c0;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_2c0 = *plVar4;
          lStack_2b8 = plVar2[3];
        }
        else {
          local_2c0 = *plVar4;
          local_2d0 = (long *)*plVar2;
        }
        local_2c8 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_318);
        local_2b0 = &local_2a0;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_2a0 = *plVar4;
          lStack_298 = plVar2[3];
        }
        else {
          local_2a0 = *plVar4;
          local_2b0 = (long *)*plVar2;
        }
        local_2a8 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_2b0);
        local_290 = &local_280;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_280 = *plVar4;
          lStack_278 = plVar2[3];
        }
        else {
          local_280 = *plVar4;
          local_290 = (long *)*plVar2;
        }
        local_288 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_318);
        local_270 = &local_260;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_260 = *plVar4;
          lStack_258 = plVar2[3];
        }
        else {
          local_260 = *plVar4;
          local_270 = (long *)*plVar2;
        }
        local_268 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_270);
        local_250 = &local_240;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_240 = *plVar4;
          lStack_238 = plVar2[3];
        }
        else {
          local_240 = *plVar4;
          local_250 = (long *)*plVar2;
        }
        local_248 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_1d0[0]);
        local_230 = &local_220;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_220 = *plVar4;
          lStack_218 = plVar2[3];
        }
        else {
          local_220 = *plVar4;
          local_230 = (long *)*plVar2;
        }
        local_228 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_230);
        local_210 = &local_200;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_200 = *plVar4;
          lStack_1f8 = plVar2[3];
        }
        else {
          local_200 = *plVar4;
          local_210 = (long *)*plVar2;
        }
        local_208 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_318);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_2e0 = *plVar4;
          lStack_2d8 = plVar2[3];
          local_2f0 = &local_2e0;
        }
        else {
          local_2e0 = *plVar4;
          local_2f0 = (long *)*plVar2;
        }
        local_2e8 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_198 = *plVar4;
          lStack_190 = plVar2[3];
          local_1a8 = &local_198;
        }
        else {
          local_198 = *plVar4;
          local_1a8 = (long *)*plVar2;
        }
        local_1a0 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a8);
        if (local_1a8 != &local_198) {
          operator_delete(local_1a8,local_198 + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,local_2e0 + 1);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210,local_200 + 1);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230,local_220 + 1);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250,local_240 + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,local_260 + 1);
        }
        if (local_290 != &local_280) {
          operator_delete(local_290,local_280 + 1);
        }
        if (local_2b0 != &local_2a0) {
          operator_delete(local_2b0,local_2a0 + 1);
        }
        if (local_2d0 != &local_2c0) {
          operator_delete(local_2d0,local_2c0 + 1);
        }
        if (local_1f0[0] != local_1e0) {
          operator_delete(local_1f0[0],local_1e0[0] + 1);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
      } while (local_1b0 != uVar6);
    }
    local_318 = &local_308;
    std::__cxx11::string::_M_construct((ulong)&local_318,(char)local_2f4 + '\x01');
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_318);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_198 = *plVar4;
      lStack_190 = plVar2[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar4;
      local_1a8 = (long *)*plVar2;
    }
    local_1a0 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1a8);
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if (local_318 != &local_308) {
      operator_delete(local_318,local_308 + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0104ff1f:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static string loopVertexTemplate (LoopType type, bool isVertexCase, int numLoopIterations, int nestingDepth)
{
	string resultTemplate;
	string loopBound		= type == LOOP_TYPE_STATIC	? de::toString(numLoopIterations)
							: type == LOOP_TYPE_UNIFORM	? "int(u_loopBound${NAME_SPEC})"
							: type == LOOP_TYPE_DYNAMIC	? "int(a_loopBound${NAME_SPEC})"
							: "";

	DE_ASSERT(!loopBound.empty());

	resultTemplate +=
		"attribute highp vec4 a_position${NAME_SPEC};\n";

	if (type == LOOP_TYPE_DYNAMIC)
		resultTemplate +=
			"attribute mediump float a_loopBound${NAME_SPEC};\n";

	resultTemplate +=
		"attribute mediump vec4 a_value${NAME_SPEC};\n"
		"varying mediump vec4 v_value${NAME_SPEC};\n";

	if (isVertexCase)
	{
		if (type == LOOP_TYPE_UNIFORM)
			resultTemplate += "uniform mediump float u_loopBound${NAME_SPEC};\n";

		resultTemplate +=
			"\n"
			"void main()\n"
			"{\n"
			"	gl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n"
			"	mediump vec4 value = a_value${NAME_SPEC};\n";

		for (int i = 0; i < nestingDepth; i++)
		{
			string iterName = "i" + de::toString(i);
			resultTemplate += string(i + 1, '\t') + "for (int " + iterName + " = 0; " + iterName + " < " + loopBound + "; " + iterName + "++)\n";
		}

		resultTemplate += string(nestingDepth + 1, '\t') + "value *= a_value${NAME_SPEC};\n";

		resultTemplate +=
			"	v_value${NAME_SPEC} = value;\n";
	}
	else
	{
		if (type == LOOP_TYPE_DYNAMIC)
			resultTemplate +=
				"varying mediump float v_loopBound${NAME_SPEC};\n";

		resultTemplate +=
			"\n"
			"void main()\n"
			"{\n"
			"	gl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n"
			"	v_value${NAME_SPEC} = a_value${NAME_SPEC};\n";

		if (type == LOOP_TYPE_DYNAMIC)
			resultTemplate +=
				"	v_loopBound${NAME_SPEC} = a_loopBound${NAME_SPEC};\n";
	}

	resultTemplate +=
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}